

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

saint_t sufcheck64(sauchar_t *T,saidx64_t *SA,saidx64_t n,saint_t verbose)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  saidx64_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  saint_t sVar10;
  saidx64_t C [256];
  
  if (verbose != 0) {
    sufcheck64_cold_1();
  }
  if ((SA == (saidx64_t *)0x0 || T == (sauchar_t *)0x0) || n < 0) {
    sVar10 = -1;
    if (verbose != 0) {
      sufcheck64_cold_4();
    }
  }
  else if (n == 0) {
    sVar10 = 0;
    if (verbose != 0) {
      sufcheck64_cold_3();
    }
  }
  else {
    lVar3 = 0;
    do {
      if ((ulong)n <= (ulong)SA[lVar3]) {
        if (verbose == 0) {
          return -2;
        }
        fprintf(_stderr,"Out of the range [0,%ld].\n  SA[%ld]=%ld\n",n + -1);
        return -2;
      }
      lVar3 = lVar3 + 1;
    } while (n != lVar3);
    if (1 < n) {
      lVar3 = 1;
      do {
        if (T[SA[lVar3]] < T[SA[lVar3 + -1]]) {
          if (verbose == 0) {
            return -3;
          }
          fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%ld]=%ld]=%d > T[SA[%ld]=%ld]=%d\n",
                  lVar3 + -1);
          return -3;
        }
        lVar3 = lVar3 + 1;
      } while (n != lVar3);
    }
    lVar9 = 0;
    memset(C,0,0x800);
    lVar3 = 1;
    if (1 < n) {
      lVar3 = n;
    }
    do {
      C[T[lVar9]] = C[T[lVar9]] + 1;
      lVar9 = lVar9 + 1;
    } while (lVar3 != lVar9);
    lVar9 = 0;
    lVar3 = 0;
    do {
      lVar6 = C[lVar9];
      C[lVar9] = lVar3;
      lVar9 = lVar9 + 1;
      lVar3 = lVar6 + lVar3;
    } while (lVar9 != 0x100);
    bVar1 = T[n + -1];
    lVar3 = C[bVar1];
    C[bVar1] = lVar3 + 1;
    lVar9 = 1;
    if (1 < n) {
      lVar9 = n;
    }
    lVar6 = 0;
    do {
      lVar2 = SA[lVar6];
      uVar7 = (ulong)bVar1;
      lVar5 = lVar3;
      lVar8 = n + -1;
      if (0 < lVar2) {
        lVar8 = lVar2 + -1;
        uVar7 = (ulong)T[lVar2 + -1];
        lVar5 = C[uVar7];
      }
      if ((lVar5 < 0) || (lVar8 != SA[lVar5])) {
        if (verbose == 0) {
          return -4;
        }
        sVar4 = -1;
        if (-1 < lVar5) {
          sVar4 = SA[lVar5];
        }
        fprintf(_stderr,"Suffix in wrong position.\n  SA[%ld]=%ld or\n  SA[%ld]=%ld\n",lVar5,sVar4);
        return -4;
      }
      if (lVar5 != lVar3) {
        lVar2 = C[uVar7];
        lVar8 = lVar2 + 1;
        C[uVar7] = lVar8;
        if ((n <= lVar8) || (T[SA[lVar2 + 1]] != (sauchar_t)uVar7)) {
          C[uVar7] = -1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar9 != lVar6);
    sVar10 = 0;
    if (0 < verbose) {
      sufcheck64_cold_2();
      sVar10 = 0;
    }
  }
  return sVar10;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}